

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

char * rbuObjIterGetIndexCols
                 (sqlite3rbu *p,RbuObjIter *pIter,char **pzImposterCols,char **pzImposterPk,
                 char **pzWhere,int *pnBind)

{
  sqlite3 *db;
  int iVar1;
  int iVar2;
  char *pcVar3;
  uchar *puVar4;
  bool bVar5;
  char *zOrder;
  char *pcStack_a0;
  int i;
  char *zType;
  char *zCol;
  char *zCollate;
  int bDesc;
  int iCid;
  sqlite3_stmt *pXInfo;
  char *zAnd;
  char *zCom;
  char *pcStack_60;
  int nBind;
  char *zWhere;
  char *zImpPK;
  char *zImpCols;
  char *zRet;
  int rc2;
  int rc;
  int *pnBind_local;
  char **pzWhere_local;
  char **pzImposterPk_local;
  char **pzImposterCols_local;
  RbuObjIter *pIter_local;
  sqlite3rbu *p_local;
  
  zRet._4_4_ = p->rc;
  zImpCols = (char *)0x0;
  zImpPK = (char *)0x0;
  zWhere = (char *)0x0;
  pcStack_60 = (char *)0x0;
  zCom._4_4_ = 0;
  zAnd = "";
  pXInfo = (sqlite3_stmt *)0x2562b7;
  _bDesc = (sqlite3_stmt *)0x0;
  _rc2 = (uint *)pnBind;
  pnBind_local = (int *)pzWhere;
  pzWhere_local = pzImposterPk;
  pzImposterPk_local = pzImposterCols;
  pzImposterCols_local = (char **)pIter;
  pIter_local = (RbuObjIter *)p;
  if (zRet._4_4_ == 0) {
    db = p->dbMain;
    pcVar3 = sqlite3_mprintf("PRAGMA main.index_xinfo = %Q",pIter->zIdx);
    zRet._4_4_ = prepareFreeAndCollectError(db,(sqlite3_stmt **)&bDesc,&p->zErrmsg,pcVar3);
  }
  while( true ) {
    bVar5 = false;
    if (zRet._4_4_ == 0) {
      iVar1 = sqlite3_step(_bDesc);
      bVar5 = iVar1 == 100;
    }
    if (!bVar5) break;
    iVar1 = sqlite3_column_int(_bDesc,1);
    iVar2 = sqlite3_column_int(_bDesc,3);
    puVar4 = sqlite3_column_text(_bDesc,4);
    if (iVar1 < 0) {
      if (*(int *)(pzImposterCols_local + 9) == 2) {
        for (zOrder._4_4_ = 0; pzImposterCols_local[6][zOrder._4_4_] == '\0';
            zOrder._4_4_ = zOrder._4_4_ + 1) {
        }
        zType = *(char **)(pzImposterCols_local[3] + (long)zOrder._4_4_ * 8);
      }
      else if (pIter_local->azTblCol == (char **)0x0) {
        zType = "_rowid_";
      }
      else {
        zType = "rbu_rowid";
      }
      pcStack_a0 = "INTEGER";
    }
    else {
      zType = *(char **)(pzImposterCols_local[3] + (long)iVar1 * 8);
      pcStack_a0 = *(char **)(pzImposterCols_local[4] + (long)iVar1 * 8);
    }
    zImpCols = sqlite3_mprintf("%z%s\"%w\" COLLATE %Q",zImpCols,zAnd,zType,puVar4);
    if ((*(int *)(pzImposterCols_local + 0xe) == 0) ||
       (iVar1 = sqlite3_column_int(_bDesc,5), iVar1 != 0)) {
      pcVar3 = "";
      if (iVar2 != 0) {
        pcVar3 = " DESC";
      }
      zWhere = sqlite3_mprintf("%z%s\"rbu_imp_%d%w\"%s",zWhere,zAnd,(ulong)zCom._4_4_,zType,pcVar3);
    }
    zImpPK = sqlite3_mprintf("%z%s\"rbu_imp_%d%w\" %s COLLATE %Q",zImpPK,zAnd,(ulong)zCom._4_4_,
                             zType,pcStack_a0,puVar4);
    pcStack_60 = sqlite3_mprintf("%z%s\"rbu_imp_%d%w\" IS ?",pcStack_60,pXInfo,(ulong)zCom._4_4_,
                                 zType);
    if ((((zImpCols == (char *)0x0) || (zWhere == (char *)0x0)) || (zImpPK == (char *)0x0)) ||
       (pcStack_60 == (char *)0x0)) {
      zRet._4_4_ = 7;
    }
    zAnd = ", ";
    pXInfo = (sqlite3_stmt *)anon_var_dwarf_1e918;
    zCom._4_4_ = zCom._4_4_ + 1;
  }
  zRet._0_4_ = sqlite3_finalize(_bDesc);
  if (zRet._4_4_ == 0) {
    zRet._4_4_ = (int)zRet;
  }
  if (zRet._4_4_ != 0) {
    sqlite3_free(zImpCols);
    sqlite3_free(zImpPK);
    sqlite3_free(zWhere);
    sqlite3_free(pcStack_60);
    zImpCols = (char *)0x0;
    zImpPK = (char *)0x0;
    zWhere = (char *)0x0;
    pcStack_60 = (char *)0x0;
    *(int *)&pIter_local->abNotNull = zRet._4_4_;
  }
  *pzImposterPk_local = zImpPK;
  *pzWhere_local = zWhere;
  *(char **)pnBind_local = pcStack_60;
  *_rc2 = zCom._4_4_;
  return zImpCols;
}

Assistant:

static char *rbuObjIterGetIndexCols(
  sqlite3rbu *p,                  /* RBU object */
  RbuObjIter *pIter,              /* Object iterator for column names */
  char **pzImposterCols,          /* OUT: Columns for imposter table */
  char **pzImposterPk,            /* OUT: Imposter PK clause */
  char **pzWhere,                 /* OUT: WHERE clause */
  int *pnBind                     /* OUT: Trbul number of columns */
){
  int rc = p->rc;                 /* Error code */
  int rc2;                        /* sqlite3_finalize() return code */
  char *zRet = 0;                 /* String to return */
  char *zImpCols = 0;             /* String to return via *pzImposterCols */
  char *zImpPK = 0;               /* String to return via *pzImposterPK */
  char *zWhere = 0;               /* String to return via *pzWhere */
  int nBind = 0;                  /* Value to return via *pnBind */
  const char *zCom = "";          /* Set to ", " later on */
  const char *zAnd = "";          /* Set to " AND " later on */
  sqlite3_stmt *pXInfo = 0;       /* PRAGMA index_xinfo = ? */

  if( rc==SQLITE_OK ){
    assert( p->zErrmsg==0 );
    rc = prepareFreeAndCollectError(p->dbMain, &pXInfo, &p->zErrmsg,
        sqlite3_mprintf("PRAGMA main.index_xinfo = %Q", pIter->zIdx)
    );
  }

  while( rc==SQLITE_OK && SQLITE_ROW==sqlite3_step(pXInfo) ){
    int iCid = sqlite3_column_int(pXInfo, 1);
    int bDesc = sqlite3_column_int(pXInfo, 3);
    const char *zCollate = (const char*)sqlite3_column_text(pXInfo, 4);
    const char *zCol;
    const char *zType;

    if( iCid<0 ){
      /* An integer primary key. If the table has an explicit IPK, use
      ** its name. Otherwise, use "rbu_rowid".  */
      if( pIter->eType==RBU_PK_IPK ){
        int i;
        for(i=0; pIter->abTblPk[i]==0; i++);
        assert( i<pIter->nTblCol );
        zCol = pIter->azTblCol[i];
      }else if( rbuIsVacuum(p) ){
        zCol = "_rowid_";
      }else{
        zCol = "rbu_rowid";
      }
      zType = "INTEGER";
    }else{
      zCol = pIter->azTblCol[iCid];
      zType = pIter->azTblType[iCid];
    }

    zRet = sqlite3_mprintf("%z%s\"%w\" COLLATE %Q", zRet, zCom, zCol, zCollate);
    if( pIter->bUnique==0 || sqlite3_column_int(pXInfo, 5) ){
      const char *zOrder = (bDesc ? " DESC" : "");
      zImpPK = sqlite3_mprintf("%z%s\"rbu_imp_%d%w\"%s", 
          zImpPK, zCom, nBind, zCol, zOrder
      );
    }
    zImpCols = sqlite3_mprintf("%z%s\"rbu_imp_%d%w\" %s COLLATE %Q", 
        zImpCols, zCom, nBind, zCol, zType, zCollate
    );
    zWhere = sqlite3_mprintf(
        "%z%s\"rbu_imp_%d%w\" IS ?", zWhere, zAnd, nBind, zCol
    );
    if( zRet==0 || zImpPK==0 || zImpCols==0 || zWhere==0 ) rc = SQLITE_NOMEM;
    zCom = ", ";
    zAnd = " AND ";
    nBind++;
  }

  rc2 = sqlite3_finalize(pXInfo);
  if( rc==SQLITE_OK ) rc = rc2;

  if( rc!=SQLITE_OK ){
    sqlite3_free(zRet);
    sqlite3_free(zImpCols);
    sqlite3_free(zImpPK);
    sqlite3_free(zWhere);
    zRet = 0;
    zImpCols = 0;
    zImpPK = 0;
    zWhere = 0;
    p->rc = rc;
  }

  *pzImposterCols = zImpCols;
  *pzImposterPk = zImpPK;
  *pzWhere = zWhere;
  *pnBind = nBind;
  return zRet;
}